

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
::operator++(iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
             *this)

{
  bool bVar1;
  set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
  *this_00;
  reference ppMVar2;
  Node *pNVar3;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *in_RDI;
  Tree *tree;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *in_stack_00000030;
  bool is_list;
  TreeIterator tree_it;
  _Rb_tree_const_iterator<google::protobuf::MapKey_*> *in_stack_ffffffffffffff70;
  _Self local_78;
  void *local_70;
  undefined1 local_11;
  _Rb_tree_const_iterator<google::protobuf::MapKey_*> in_stack_fffffffffffffff0;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  *this_01;
  
  if (in_RDI->node_->next == (Node *)0x0) {
    this_01 = in_RDI;
    std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<google::protobuf::MapKey_*> *)&stack0xfffffffffffffff0);
    local_11 = revalidate_if_necessary(this_01,(TreeIterator *)in_stack_fffffffffffffff0._M_node);
    if ((bool)local_11) {
      SearchFrom(in_stack_00000030,(size_type)tree);
    }
    else {
      local_70 = in_RDI->m_->table_[in_RDI->bucket_index_];
      this_00 = (set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                 *)std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator++
                             (in_stack_ffffffffffffff70);
      local_78._M_node =
           (_Base_ptr)
           std::
           set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
           ::end(this_00);
      bVar1 = std::operator==((_Self *)this_00,&local_78);
      if (bVar1) {
        SearchFrom(in_stack_00000030,(size_type)tree);
      }
      else {
        ppMVar2 = std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>::operator*
                            (in_stack_ffffffffffffff70);
        pNVar3 = NodePtrFromKeyPtr(*ppMVar2);
        in_RDI->node_ = pNVar3;
      }
    }
  }
  else {
    in_RDI->node_ = in_RDI->node_->next;
  }
  return in_RDI;
}

Assistant:

iterator_base& operator++() {
        if (node_->next == NULL) {
          TreeIterator tree_it;
          const bool is_list = revalidate_if_necessary(&tree_it);
          if (is_list) {
            SearchFrom(bucket_index_ + 1);
          } else {
            GOOGLE_DCHECK_EQ(bucket_index_ & 1, 0u);
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            if (++tree_it == tree->end()) {
              SearchFrom(bucket_index_ + 2);
            } else {
              node_ = NodePtrFromKeyPtr(*tree_it);
            }
          }
        } else {
          node_ = node_->next;
        }
        return *this;
      }